

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O0

deUint32 glu::chooseColorFormat(RenderConfig *config)

{
  int iVar1;
  int *piVar2;
  TextureFormat local_38;
  undefined1 local_30 [8];
  IVec4 bits;
  deUint32 format;
  int fmtNdx;
  RenderConfig *config_local;
  
  bits.m_data[3] = 0;
  while( true ) {
    if (7 < bits.m_data[3]) {
      return 0;
    }
    bits.m_data[2] = chooseColorFormat::s_formats[bits.m_data[3]];
    local_38 = mapGLInternalFormat(bits.m_data[2]);
    tcu::getTextureFormatBitDepth((tcu *)local_30,&local_38);
    if (((((config->redBits == -1) ||
          (iVar1 = config->redBits,
          piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_30,0), iVar1 == *piVar2))
         && ((config->greenBits == -1 ||
             (iVar1 = config->greenBits,
             piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_30,1),
             iVar1 == *piVar2)))) &&
        ((config->blueBits == -1 ||
         (iVar1 = config->blueBits,
         piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_30,2), iVar1 == *piVar2)))
        ) && ((config->alphaBits == -1 ||
              (iVar1 = config->alphaBits,
              piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_30,3),
              iVar1 == *piVar2)))) break;
    bits.m_data[3] = bits.m_data[3] + 1;
  }
  return bits.m_data[2];
}

Assistant:

deUint32 chooseColorFormat (const glu::RenderConfig& config)
{
	static const deUint32 s_formats[] =
	{
		GL_RGBA8,
		GL_RGB8,
		GL_RG8,
		GL_R8,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGB565,
		GL_RGB5
	};

	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(s_formats); fmtNdx++)
	{
		const deUint32		format	= s_formats[fmtNdx];
		const tcu::IVec4	bits	= tcu::getTextureFormatBitDepth(glu::mapGLInternalFormat(format));

		if (config.redBits != glu::RenderConfig::DONT_CARE &&
			config.redBits != bits[0])
			continue;

		if (config.greenBits != glu::RenderConfig::DONT_CARE &&
			config.greenBits != bits[1])
			continue;

		if (config.blueBits != glu::RenderConfig::DONT_CARE &&
			config.blueBits != bits[2])
			continue;

		if (config.alphaBits != glu::RenderConfig::DONT_CARE &&
			config.alphaBits != bits[3])
			continue;

		return format;
	}

	return 0;
}